

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbd_standalone.cpp
# Opt level: O0

void __thiscall Intel_V4L2::getLRFrames(Intel_V4L2 *this,uchar *left_rect,uchar *right_rect)

{
  uchar uVar1;
  ushort uVar2;
  int iVar3;
  ostream *this_00;
  uchar *puVar4;
  int local_3d8;
  int local_3d4;
  int j_1;
  int i_1;
  MatExpr local_270 [8];
  Mat rightMat;
  MatExpr local_200 [352];
  MatExpr local_a0 [8];
  Mat leftMat;
  int local_38;
  int iStack_34;
  unsigned_short lr_pixel;
  int j;
  int i;
  unsigned_short *interlacedBuffer;
  int status;
  uchar *right_rect_local;
  uchar *left_rect_local;
  Intel_V4L2 *this_local;
  
  iVar3 = capture_frame(this);
  if (iVar3 == 0) {
    puVar4 = this->m_pBigBuffer;
    for (iStack_34 = 0; iStack_34 < 0x1e0; iStack_34 = iStack_34 + 1) {
      for (local_38 = 0; local_38 < 0x280; local_38 = local_38 + 1) {
        uVar2 = *(ushort *)(puVar4 + (long)(iStack_34 * 0x280 + local_38) * 2);
        left_rect[iStack_34 * 0x280 + local_38] = (uchar)((ulong)uVar2 % 0x100);
        right_rect[iStack_34 * 0x280 + local_38] = (uchar)((ulong)uVar2 / 0x100);
      }
    }
    cv::Mat::zeros((int)local_200,0x1e0,0x280);
    cv::MatExpr::operator_cast_to_Mat(local_a0);
    cv::MatExpr::~MatExpr(local_200);
    cv::Mat::zeros((int)&j_1,0x1e0,0x280);
    cv::MatExpr::operator_cast_to_Mat(local_270);
    cv::MatExpr::~MatExpr((MatExpr *)&j_1);
    for (local_3d4 = 0; local_3d4 < 0x1e0; local_3d4 = local_3d4 + 1) {
      for (local_3d8 = 0; local_3d8 < 0x280; local_3d8 = local_3d8 + 1) {
        uVar1 = left_rect[local_3d4 * 0x280 + local_3d8];
        puVar4 = cv::Mat::at<unsigned_char>((Mat *)local_a0,local_3d4,local_3d8);
        *puVar4 = uVar1;
        uVar1 = right_rect[local_3d4 * 0x280 + local_3d8];
        puVar4 = cv::Mat::at<unsigned_char>((Mat *)local_270,local_3d4,local_3d8);
        *puVar4 = uVar1;
      }
    }
    CameraBase::saveFrame(&this->super_CameraBase,(Mat *)local_a0,(Mat *)local_270);
    CameraBase::incrementFrameCount(&this->super_CameraBase);
    cv::Mat::~Mat((Mat *)local_270);
    cv::Mat::~Mat((Mat *)local_a0);
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,"Error : failed to capture Infrared frame.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Intel_V4L2::getLRFrames (unsigned char *left_rect, unsigned char *right_rect) {
    int status = capture_frame ();
    if (0 != status) {
        std::cout << "Error : failed to capture Infrared frame." << std::endl;
        return;
    }
    unsigned short *interlacedBuffer = (unsigned short *) m_pBigBuffer;
    for (int i = 0; i < 480; i++) {
        for (int j = 0; j < 640; j++) {
            unsigned short lr_pixel = interlacedBuffer[i*640+j];
            left_rect[i*640+j]  = lr_pixel % 256;
            right_rect[i*640+j] = lr_pixel / 256;
        }
    }

    #if 1
    cv::Mat leftMat  = cv::Mat::zeros (480, 640, CV_8U);
    cv::Mat rightMat = cv::Mat::zeros (480, 640, CV_8U);

    for (int i = 0; i < 480; i++) {
        for (int j = 0; j < 640; j++) {
            leftMat.at<uchar>(i, j)  = left_rect[i*640+j];
            rightMat.at<uchar>(i, j) = right_rect[i*640+j];
        }
    }

    saveFrame (leftMat, rightMat);

    incrementFrameCount ();
    #endif
}